

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

long __thiscall tetgenmesh::lawsonflip3d(tetgenmesh *this,flipconstraints *fc)

{
  double *pa;
  double *pb;
  double *pc;
  double *pd_00;
  double dVar1;
  double dVar2;
  uint uVar3;
  bool bVar4;
  verttype vVar5;
  point pdVar6;
  point pdVar7;
  point pdVar8;
  point pdVar9;
  triface *local_118;
  uint local_110;
  int i;
  int t1ver;
  long sliver_peels;
  long totalcount;
  long flipcount;
  double len3;
  double vol;
  double ori;
  double sign;
  point *pts;
  point pe;
  point pd;
  badface *bface;
  badface *popface;
  face casingout;
  face checksh;
  triface hulltet;
  triface neightet;
  triface fliptets [5];
  flipconstraints *fc_local;
  tetgenmesh *this_local;
  
  local_118 = (triface *)&neightet.ver;
  fliptets[4]._8_8_ = fc;
  do {
    triface::triface(local_118);
    local_118 = local_118 + 1;
  } while (local_118 != (triface *)&fliptets[4].ver);
  triface::triface((triface *)&hulltet.ver);
  triface::triface((triface *)&checksh.shver);
  face::face((face *)&casingout.shver);
  face::face((face *)&popface);
  sliver_peels = 0;
  _i = 0;
  do {
    if (2 < this->b->verbose) {
      printf("      Lawson flip %ld faces.\n",this->flippool->items);
    }
    totalcount = 0;
LAB_00162a44:
    if (this->flipstack != (badface *)0x0) {
      bface = this->flipstack;
      triface::operator=((triface *)&neightet.ver,&bface->tt);
      this->flipstack = this->flipstack->nextitem;
      memorypool::dealloc(this->flippool,bface);
      bVar4 = isdeadtet(this,(triface *)&neightet.ver);
      if ((!bVar4) && (bVar4 = facemarked(this,(triface *)&neightet.ver), bVar4)) {
        unmarkface(this,(triface *)&neightet.ver);
        bVar4 = ishulltet(this,(triface *)&neightet.ver);
        if (!bVar4) {
          fsym(this,(triface *)&neightet.ver,(triface *)&fliptets[0].ver);
          bVar4 = ishulltet(this,(triface *)&fliptets[0].ver);
          if (bVar4) {
            if (this->nonconvex != 0) {
              tspivot(this,(triface *)&neightet.ver,(face *)&casingout.shver);
              for (local_110 = 0; (int)local_110 < 3; local_110 = local_110 + 1) {
                if (*(long *)(casingout._8_8_ + (long)(((int)checksh.sh >> 1) + 6) * 8) == 0) {
                  spivot(this,(face *)&casingout.shver,(face *)&popface);
                  pdVar6 = sorg(this,(face *)&casingout.shver);
                  pdVar7 = sdest(this,(face *)&popface);
                  if (pdVar6 != pdVar7) {
                    sesymself(this,(face *)&popface);
                  }
                  stpivot(this,(face *)&popface,(triface *)&hulltet.ver);
                  if (hulltet._8_8_ == neightet._8_8_) {
                    edestoppo(this,(triface *)&hulltet.ver,(triface *)&checksh.shver);
                    uVar3 = (uint)hulltet.tet;
                    decode(this,*(tetrahedron *)
                                 (checksh._8_8_ + (long)(int)((uint)hulltet.tet & 3) * 8),
                           (triface *)&checksh.shver);
                    hulltet.tet._0_4_ = fsymtbl[(int)uVar3][(int)(uint)hulltet.tet];
                    pdVar6 = oppo(this,(triface *)&checksh.shver);
                    if (pdVar6 == this->dummypoint) {
                      pdVar6 = org(this,(triface *)&hulltet.ver);
                      vVar5 = pointtype(this,pdVar6);
                      if ((vVar5 == FREEFACETVERTEX) ||
                         (vVar5 = pointtype(this,pdVar6), vVar5 == FREESEGVERTEX)) {
                        removevertexbyflips(this,pdVar6);
                      }
                    }
                    else {
                      eorgoppo(this,(triface *)&hulltet.ver,(triface *)&checksh.shver);
                      uVar3 = (uint)hulltet.tet;
                      decode(this,*(tetrahedron *)
                                   (checksh._8_8_ + (long)(int)((uint)hulltet.tet & 3) * 8),
                             (triface *)&checksh.shver);
                      hulltet.tet._0_4_ = fsymtbl[(int)uVar3][(int)(uint)hulltet.tet];
                      pdVar6 = oppo(this,(triface *)&checksh.shver);
                      if (pdVar6 == this->dummypoint) {
                        pdVar6 = dest(this,(triface *)&hulltet.ver);
                        vVar5 = pointtype(this,pdVar6);
                        if ((vVar5 == FREEFACETVERTEX) ||
                           (vVar5 = pointtype(this,pdVar6), vVar5 == FREESEGVERTEX)) {
                          removevertexbyflips(this,pdVar6);
                        }
                      }
                      else {
                        triface::operator=((triface *)&neightet.ver,(triface *)&hulltet.ver);
                        fnext(this,(triface *)&neightet.ver,(triface *)&fliptets[0].ver);
                        fnext(this,(triface *)&fliptets[0].ver,(triface *)&fliptets[1].ver);
                        flip32(this,(triface *)&neightet.ver,1,(flipconstraints *)fliptets[4]._8_8_)
                        ;
                        this->flip32count = this->flip32count + -1;
                        this->flip22count = this->flip22count + -1;
                        _i = _i + 1;
                        if (*(int *)(fliptets[4]._8_8_ + 0x14) != 0) {
                          this->tetprism_vol_sum =
                               *(double *)(fliptets[4]._8_8_ + 0x20) + this->tetprism_vol_sum;
                          *(undefined8 *)(fliptets[4]._8_8_ + 0x20) = 0;
                        }
                      }
                    }
                    break;
                  }
                }
                senextself(this,(face *)&casingout.shver);
              }
            }
          }
          else if (((this->checksubfaceflag == 0) || (*(long *)(neightet._8_8_ + 0x48) == 0)) ||
                  (*(long *)(*(long *)(neightet._8_8_ + 0x48) +
                            (long)(int)((uint)fliptets[0].tet & 3) * 8) == 0)) {
            pa = *(double **)(fliptets[0]._8_8_ + 0x20);
            pb = *(double **)(fliptets[0]._8_8_ + 0x28);
            pc = *(double **)(fliptets[0]._8_8_ + 0x30);
            pd_00 = *(double **)(fliptets[0]._8_8_ + 0x38);
            pdVar6 = oppo(this,(triface *)&neightet.ver);
            dVar1 = insphere_s(this,pa,pb,pc,pd_00,pdVar6);
            if (dVar1 < 0.0) {
              pdVar6 = oppo(this,(triface *)&neightet.ver);
              pdVar7 = oppo(this,(triface *)&fliptets[0].ver);
              dVar1 = distance(this,pdVar6,pdVar7);
              for (local_110 = 0; (int)local_110 < 3; local_110 = local_110 + 1) {
                pdVar8 = org(this,(triface *)&neightet.ver);
                pdVar9 = dest(this,(triface *)&neightet.ver);
                vol = orient3d(pdVar8,pdVar9,pdVar6,pdVar7);
                if (0.0 < vol) {
                  esym(this,(triface *)&neightet.ver,(triface *)&fliptets[1].ver);
                  esym(this,(triface *)&fliptets[0].ver,(triface *)&fliptets[2].ver);
                  if (((*(long *)(fliptets[1]._8_8_ + 0x48) != 0) &&
                      (*(long *)(*(long *)(fliptets[1]._8_8_ + 0x48) +
                                (long)(int)((uint)fliptets[2].tet & 3) * 8) != 0)) ||
                     ((*(long *)(fliptets[2]._8_8_ + 0x48) != 0 &&
                      (*(long *)(*(long *)(fliptets[2]._8_8_ + 0x48) +
                                (long)(int)((uint)fliptets[3].tet & 3) * 8) != 0)))) {
                    pdVar8 = org(this,(triface *)&neightet.ver);
                    pdVar9 = dest(this,(triface *)&neightet.ver);
                    dVar2 = orient3dfast(this,pdVar8,pdVar9,pdVar6,pdVar7);
                    if (ABS(dVar2) / (dVar1 * dVar1 * dVar1) < this->b->epsilon) {
                      vol = 0.0;
                    }
                  }
                }
                if (vol <= 0.0) break;
                enextself(this,(triface *)&neightet.ver);
                eprevself(this,(triface *)&fliptets[0].ver);
              }
              if (0.0 < vol) {
                flip23(this,(triface *)&neightet.ver,0,(flipconstraints *)fliptets[4]._8_8_);
                totalcount = totalcount + 1;
                if (*(int *)(fliptets[4]._8_8_ + 0x14) != 0) {
                  this->tetprism_vol_sum =
                       *(double *)(fliptets[4]._8_8_ + 0x20) + this->tetprism_vol_sum;
                  *(undefined8 *)(fliptets[4]._8_8_ + 0x20) = 0;
                }
              }
              else if (((this->checksubsegflag == 0) || (*(long *)(neightet._8_8_ + 0x40) == 0)) ||
                      (*(long *)(*(long *)(neightet._8_8_ + 0x40) +
                                (long)ver2edge[(int)(uint)fliptets[0].tet] * 8) == 0)) {
                esymself(this,(triface *)&neightet.ver);
                for (local_110 = 0; (int)local_110 < 3; local_110 = local_110 + 1) {
                  fnext(this,(triface *)&fliptets[(long)(int)local_110 + -1].ver,
                        (triface *)&fliptets[(long)(int)(local_110 + 1) + -1].ver);
                }
                if (fliptets[2]._8_8_ != neightet._8_8_) {
                  fnext(this,(triface *)&fliptets[2].ver,(triface *)&fliptets[3].ver);
                  if (fliptets[3]._8_8_ == neightet._8_8_) {
                    if ((this->nonconvex != 0) &&
                       (pdVar6 = apex(this,(triface *)&fliptets[2].ver), pdVar6 == this->dummypoint)
                       ) {
                      vol = 0.0;
                    }
                    if ((vol == 0.0) && (!NAN(vol))) {
                      esymself(this,(triface *)&neightet.ver);
                      flip23(this,(triface *)&neightet.ver,0,(flipconstraints *)fliptets[4]._8_8_);
                      fnext(this,(triface *)&fliptets[2].ver,(triface *)&fliptets[0].ver);
                      fnext(this,(triface *)&fliptets[0].ver,(triface *)&fliptets[1].ver);
                      pdVar6 = apex(this,(triface *)&fliptets[2].ver);
                      flip32(this,(triface *)&fliptets[0].ver,(uint)(pdVar6 == this->dummypoint),
                             (flipconstraints *)fliptets[4]._8_8_);
                      totalcount = totalcount + 1;
                      this->flip23count = this->flip23count + -1;
                      this->flip32count = this->flip32count + -1;
                      this->flip44count = this->flip44count + 1;
                      if (*(int *)(fliptets[4]._8_8_ + 0x14) != 0) {
                        this->tetprism_vol_sum =
                             *(double *)(fliptets[4]._8_8_ + 0x20) + this->tetprism_vol_sum;
                        *(undefined8 *)(fliptets[4]._8_8_ + 0x20) = 0;
                      }
                      goto LAB_00162a44;
                    }
                  }
                  arraypool::newindex(this->unflipqueue,&pd);
                  triface::operator=((triface *)pd,(triface *)&neightet.ver);
                  pdVar6 = org(this,(triface *)&neightet.ver);
                  pd[0xb] = (double)pdVar6;
                  pdVar6 = dest(this,(triface *)&neightet.ver);
                  pd[0xc] = (double)pdVar6;
                  pdVar6 = apex(this,(triface *)&neightet.ver);
                  pd[0xd] = (double)pdVar6;
                  goto LAB_00162a44;
                }
                flip32(this,(triface *)&neightet.ver,0,(flipconstraints *)fliptets[4]._8_8_);
                totalcount = totalcount + 1;
                if (*(int *)(fliptets[4]._8_8_ + 0x14) != 0) {
                  this->tetprism_vol_sum =
                       *(double *)(fliptets[4]._8_8_ + 0x20) + this->tetprism_vol_sum;
                  *(undefined8 *)(fliptets[4]._8_8_ + 0x20) = 0;
                }
              }
            }
          }
        }
      }
      goto LAB_00162a44;
    }
    if ((2 < this->b->verbose) && (0 < totalcount)) {
      printf("      Performed %ld flips.\n",totalcount);
    }
    sliver_peels = totalcount + sliver_peels;
    if ((this->unflipqueue->objects == 0) || (totalcount == 0)) {
      if (2 < this->b->verbose) {
        if (0 < sliver_peels) {
          printf("      Performed %ld flips.\n",sliver_peels);
        }
        if (0 < _i) {
          printf("      Removed %ld hull slivers.\n",_i);
        }
        if (0 < this->unflipqueue->objects) {
          printf("      %ld unflippable edges remained.\n",this->unflipqueue->objects);
        }
      }
      return sliver_peels + _i;
    }
    for (local_110 = 0; (long)(int)local_110 < this->unflipqueue->objects; local_110 = local_110 + 1
        ) {
      pd = (point)(this->unflipqueue->toparray
                   [(int)local_110 >> ((byte)this->unflipqueue->log2objectsperblock & 0x1f)] +
                  (int)((local_110 & this->unflipqueue->objectsperblockmark) *
                       this->unflipqueue->objectbytes));
      bVar4 = isdeadtet(this,(triface *)pd);
      if ((((!bVar4) && (pdVar6 = org(this,(triface *)pd), pdVar6 == (point)pd[0xb])) &&
          (pdVar6 = dest(this,(triface *)pd), pdVar6 == (point)pd[0xc])) &&
         (pdVar6 = apex(this,(triface *)pd), pdVar6 == (point)pd[0xd])) {
        flippush(this,&this->flipstack,(triface *)pd);
      }
    }
    arraypool::restart(this->unflipqueue);
  } while( true );
}

Assistant:

long tetgenmesh::lawsonflip3d(flipconstraints *fc)
{
  triface fliptets[5], neightet, hulltet;
  face checksh, casingout;
  badface *popface, *bface;
  point pd, pe, *pts;
  REAL sign, ori;
  REAL vol, len3;
  long flipcount, totalcount = 0l;
  long sliver_peels = 0l;
  int t1ver;
  int i;


  while (1) {

    if (b->verbose > 2) {
      printf("      Lawson flip %ld faces.\n", flippool->items);
    }
    flipcount = 0l;

    while (flipstack != (badface *) NULL) {
      // Pop a face from the stack.
      popface = flipstack;
      fliptets[0] = popface->tt;
      flipstack = flipstack->nextitem; // The next top item in stack.
      flippool->dealloc((void *) popface);

      // Skip it if it is a dead tet (destroyed by previous flips).
      if (isdeadtet(fliptets[0])) continue;
      // Skip it if it is not the same tet as we saved.
      if (!facemarked(fliptets[0])) continue;

      unmarkface(fliptets[0]);

      if (ishulltet(fliptets[0])) continue;

      fsym(fliptets[0], fliptets[1]);
      if (ishulltet(fliptets[1])) {
        if (nonconvex) {
          // Check if 'fliptets[0]' it is a hull sliver.
          tspivot(fliptets[0], checksh);
          for (i = 0; i < 3; i++) {
            if (!isshsubseg(checksh)) {
              spivot(checksh, casingout);
              //assert(casingout.sh != NULL);
              if (sorg(checksh) != sdest(casingout)) sesymself(casingout);
              stpivot(casingout, neightet);
              if (neightet.tet == fliptets[0].tet) {
                // Found a hull sliver 'neightet'. Let it be [e,d,a,b], where 
                //   [e,d,a] and [d,e,b] are hull faces.
                edestoppo(neightet, hulltet); // [a,b,e,d]
                fsymself(hulltet); // [b,a,e,#]
                if (oppo(hulltet) == dummypoint) {
                  pe = org(neightet);
                  if ((pointtype(pe) == FREEFACETVERTEX) ||
                      (pointtype(pe) == FREESEGVERTEX)) {
                    removevertexbyflips(pe);
                  }
                } else {
                  eorgoppo(neightet, hulltet); // [b,a,d,e]
                  fsymself(hulltet); // [a,b,d,#]
                  if (oppo(hulltet) == dummypoint) {
                    pd = dest(neightet);
                    if ((pointtype(pd) == FREEFACETVERTEX) ||
                        (pointtype(pd) == FREESEGVERTEX)) {
                      removevertexbyflips(pd);
                    }
                  } else {
                    // Perform a 3-to-2 flip to remove the sliver.
                    fliptets[0] = neightet;          // [e,d,a,b]
                    fnext(fliptets[0], fliptets[1]); // [e,d,b,c]
                    fnext(fliptets[1], fliptets[2]); // [e,d,c,a]
                    flip32(fliptets, 1, fc);
                    // Update counters.
                    flip32count--;
                    flip22count--;
                    sliver_peels++;
                    if (fc->remove_ndelaunay_edge) {
                      // Update the volume (must be decreased).
                      //assert(fc->tetprism_vol_sum <= 0);
                      tetprism_vol_sum += fc->tetprism_vol_sum;
                      fc->tetprism_vol_sum = 0.0; // Clear it.
                    }
                  }
                }
                break;
              } // if (neightet.tet == fliptets[0].tet)
            } // if (!isshsubseg(checksh))
            senextself(checksh);
          } // i
        } // if (nonconvex)
        continue;
      }

      if (checksubfaceflag) {
        // Do not flip if it is a subface.
        if (issubface(fliptets[0])) continue;
      }

      // Test whether the face is locally Delaunay or not.
      pts = (point *) fliptets[1].tet; 
      sign = insphere_s(pts[4], pts[5], pts[6], pts[7], oppo(fliptets[0]));

      if (sign < 0) {
        // A non-Delaunay face. Try to flip it.
        pd = oppo(fliptets[0]);
        pe = oppo(fliptets[1]);

        // Use the length of the edge [d,e] as a reference to determine
        //   a nearly degenerated new tet.
        len3 = distance(pd, pe);
        len3 = (len3 * len3 * len3);

        // Check the convexity of its three edges. Stop checking either a
        //   locally non-convex edge (ori < 0) or a flat edge (ori = 0) is
        //   encountered, and 'fliptet' represents that edge.
        for (i = 0; i < 3; i++) {
          ori = orient3d(org(fliptets[0]), dest(fliptets[0]), pd, pe);
          if (ori > 0) {
            // Avoid creating a nearly degenerated new tet at boundary.
            //   Re-use fliptets[2], fliptets[3];
            esym(fliptets[0], fliptets[2]);
            esym(fliptets[1], fliptets[3]);
            if (issubface(fliptets[2]) || issubface(fliptets[3])) {
              vol = orient3dfast(org(fliptets[0]), dest(fliptets[0]), pd, pe);
              if ((fabs(vol) / len3) < b->epsilon) {
                ori = 0.0; // Do rounding.
              }
            }
          } // Rounding check
          if (ori <= 0) break;
          enextself(fliptets[0]);
          eprevself(fliptets[1]);
        }

        if (ori > 0) {
          // A 2-to-3 flip is found.
          //   [0] [a,b,c,d], 
          //   [1] [b,a,c,e]. no dummypoint.
          flip23(fliptets, 0, fc);
          flipcount++;
          if (fc->remove_ndelaunay_edge) {
            // Update the volume (must be decreased).
            //assert(fc->tetprism_vol_sum <= 0);
            tetprism_vol_sum += fc->tetprism_vol_sum;
            fc->tetprism_vol_sum = 0.0; // Clear it.
          }
          continue;
        } else { // ori <= 0
          // The edge ('fliptets[0]' = [a',b',c',d]) is non-convex or flat,
          //   where the edge [a',b'] is one of [a,b], [b,c], and [c,a].
          if (checksubsegflag) {
            // Do not flip if it is a segment.
            if (issubseg(fliptets[0])) continue;
          }
          // Check if there are three or four tets sharing at this edge.        
          esymself(fliptets[0]); // [b,a,d,c]
          for (i = 0; i < 3; i++) {
            fnext(fliptets[i], fliptets[i+1]);
          }
          if (fliptets[3].tet == fliptets[0].tet) {
            // A 3-to-2 flip is found. (No hull tet.)
            flip32(fliptets, 0, fc); 
            flipcount++;
            if (fc->remove_ndelaunay_edge) {
              // Update the volume (must be decreased).
              //assert(fc->tetprism_vol_sum <= 0);
              tetprism_vol_sum += fc->tetprism_vol_sum;
              fc->tetprism_vol_sum = 0.0; // Clear it.
            }
            continue;
          } else {
            // There are more than 3 tets at this edge.
            fnext(fliptets[3], fliptets[4]);
            if (fliptets[4].tet == fliptets[0].tet) {
              // There are exactly 4 tets at this edge.
              if (nonconvex) {
                if (apex(fliptets[3]) == dummypoint) {
                  // This edge is locally non-convex on the hull.
                  // It can be removed by a 4-to-4 flip.                  
                  ori = 0;
                }
              } // if (nonconvex)
              if (ori == 0) {
                // A 4-to-4 flip is found. (Two hull tets may be involved.)
                // Current tets in 'fliptets':
                //   [0] [b,a,d,c] (d may be newpt)
                //   [1] [b,a,c,e]
                //   [2] [b,a,e,f] (f may be dummypoint)
                //   [3] [b,a,f,d]
                esymself(fliptets[0]); // [a,b,c,d] 
                // A 2-to-3 flip replaces face [a,b,c] by edge [e,d].
                //   This creates a degenerate tet [e,d,a,b] (tmpfliptets[0]).
                //   It will be removed by the followed 3-to-2 flip.
                flip23(fliptets, 0, fc); // No hull tet.
                fnext(fliptets[3], fliptets[1]);
                fnext(fliptets[1], fliptets[2]);
                // Current tets in 'fliptets':
                //   [0] [...]
                //   [1] [b,a,d,e] (degenerated, d may be new point).
                //   [2] [b,a,e,f] (f may be dummypoint)
                //   [3] [b,a,f,d]
                // A 3-to-2 flip replaces edge [b,a] by face [d,e,f].
                //   Hull tets may be involved (f may be dummypoint).
                flip32(&(fliptets[1]), (apex(fliptets[3]) == dummypoint), fc);
                flipcount++;
                flip23count--;
                flip32count--;
                flip44count++;
                if (fc->remove_ndelaunay_edge) {
                  // Update the volume (must be decreased).
                  //assert(fc->tetprism_vol_sum <= 0);
                  tetprism_vol_sum += fc->tetprism_vol_sum;
                  fc->tetprism_vol_sum = 0.0; // Clear it.
                }
                continue;
              } // if (ori == 0)
            }
          }
        } // if (ori <= 0)

        // This non-Delaunay face is unflippable. Save it.
        unflipqueue->newindex((void **) &bface);
        bface->tt = fliptets[0];
        bface->forg  = org(fliptets[0]);
        bface->fdest = dest(fliptets[0]);
        bface->fapex = apex(fliptets[0]);
      } // if (sign < 0)
    } // while (flipstack)

    if (b->verbose > 2) {
      if (flipcount > 0) {
        printf("      Performed %ld flips.\n", flipcount);
      }
    }
    // Accumulate the counter of flips.
    totalcount += flipcount;

    // Return if no unflippable faces left.
    if (unflipqueue->objects == 0l) break; 
    // Return if no flip has been performed.
    if (flipcount == 0l) break;

    // Try to flip the unflippable faces.
    for (i = 0; i < unflipqueue->objects; i++) {
      bface = (badface *) fastlookup(unflipqueue, i);
      if (!isdeadtet(bface->tt) && 
          (org(bface->tt) == bface->forg) &&
          (dest(bface->tt) == bface->fdest) &&
          (apex(bface->tt) == bface->fapex)) {
        flippush(flipstack, &(bface->tt));
      }
    }
    unflipqueue->restart();

  } // while (1)

  if (b->verbose > 2) {
    if (totalcount > 0) {
      printf("      Performed %ld flips.\n", totalcount);
    }
    if (sliver_peels > 0) {
      printf("      Removed %ld hull slivers.\n", sliver_peels);
    }
    if (unflipqueue->objects > 0l) {
      printf("      %ld unflippable edges remained.\n", unflipqueue->objects);
    }
  }

  return totalcount + sliver_peels;
}